

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O2

void __thiscall
cfdcapi_common_CfdHashMessageByText_Test::cfdcapi_common_CfdHashMessageByText_Test
          (cfdcapi_common_CfdHashMessageByText_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0064f798;
  return;
}

Assistant:

TEST(cfdcapi_common, CfdHashMessageByText) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  const char* message = "The quick brown fox jumps over the lazy dog";

  ret = CfdRipemd160(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("37f332f68db77bd9d7edd4969571ad671cf9dd3b", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdSha256(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("d7a8fbb307d7809469ca9abcb0082e4f8d5651e46d3cdb762d02d0bf37c9e592", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdHash160(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("0e3397b4abc7a382b3ea2365883c3c7ca5f07600", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdHash256(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("6d37795021e544d82b41850edf7aabab9a0ebe274e54a519840c4666f35b3937", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}